

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  bool bVar1;
  string_view message;
  string local_140;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar1 = std::operator!=(&(this->tokenizer_).current_.text,value);
  if (bVar1) {
    local_120.piece_ = absl::lts_20250127::NullSafeStringView("Expected \"");
    local_60.piece_._M_str = (value->_M_dataplus)._M_p;
    local_60.piece_._M_len = value->_M_string_length;
    local_90.piece_ = absl::lts_20250127::NullSafeStringView("\", found \"");
    local_c0.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_c0.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    local_f0.piece_ = absl::lts_20250127::NullSafeStringView("\".");
    absl::lts_20250127::StrCat<>(&local_140,&local_120,&local_60,&local_90,&local_c0,&local_f0);
    message._M_str = local_140._M_dataplus._M_p;
    message._M_len = local_140._M_string_length;
    ReportError(this,message);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  return !bVar1;
}

Assistant:

bool Consume(const std::string& value) {
    const std::string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError(absl::StrCat("Expected \"", value, "\", found \"",
                               current_value, "\"."));
      return false;
    }

    tokenizer_.Next();

    return true;
  }